

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::addLocalInfo
          (CoreBroker *this,BasicHandleInfo *handleInfo,ActionMessage *message)

{
  __node_base_ptr p_Var1;
  ulong __code;
  _Hash_node_base *p_Var2;
  
  __code = (ulong)(message->source_id).gid;
  p_Var2 = (_Hash_node_base *)0x0;
  p_Var1 = CLI::std::
           _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->global_id_translation)._M_h,
                      __code % (this->global_id_translation)._M_h._M_bucket_count,
                      &message->source_id,__code);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    (handleInfo->local_fed_id).fid = *(BaseType *)((long)&p_Var2[1]._M_nxt + 4);
  }
  handleInfo->flags = message->flags;
  return;
}

Assistant:

void CoreBroker::addLocalInfo(BasicHandleInfo& handleInfo, const ActionMessage& message)
{
    auto res = global_id_translation.find(message.source_id);
    if (res != global_id_translation.end()) {
        handleInfo.local_fed_id = res->second;
    }
    handleInfo.flags = message.flags;
}